

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_peer_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *host_list,
          int port,protocol_version v)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  const_reference addr;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  torrent_peer *ptVar5;
  undefined8 uVar6;
  pointer this_01;
  int __type;
  uint local_1a0;
  address local_130;
  string local_110;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_ee;
  peer_source_flags_t local_ed;
  reason_t local_ec;
  undefined1 local_e8 [48];
  string local_b8;
  address local_98;
  undefined1 local_74 [8];
  endpoint host;
  protocol_version v_local;
  int port_local;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *host_list_local;
  error_code *e_local;
  torrent *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if ((bVar1) &&
     (uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])(), (uVar3 & 1) != 0)) {
    boost::system::error_code::message_abi_cxx11_
              ((string *)((long)&host.impl_.data_.v6.sin6_addr.__in6_u + 0xc),e);
    uVar6 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"peer name lookup error: %s",uVar6);
    ::std::__cxx11::string::~string
              ((string *)(host.impl_.data_.v6.sin6_addr.__in6_u.__u6_addr8 + 0xc));
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool(e);
  if ((((!bVar1) && ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) &&
      (bVar1 = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
               empty(host_list), !bVar1)) &&
     (uVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x11])(), (uVar3 & 1) == 0)) {
    addr = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::front
                     (host_list);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_74,addr,(unsigned_short)port);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter);
    bVar1 = false;
    if (bVar2) {
      this_00 = ::std::
                __shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_ip_filter);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_98,(basic_endpoint<boost::asio::ip::tcp> *)local_74);
      uVar3 = ip_filter::access(this_00,(char *)&local_98,__type);
      bVar1 = (uVar3 & 1) != 0;
    }
    if (bVar1) {
      uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
      if ((uVar3 & 1) != 0) {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  ((address *)(local_e8 + 0x10),(basic_endpoint<boost::asio::ip::tcp> *)local_74);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_b8,(address *)(local_e8 + 0x10));
        uVar6 = ::std::__cxx11::string::c_str();
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"blocked ip from tracker: %s",uVar6);
        ::std::__cxx11::string::~string((string *)&local_b8);
      }
      iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      bVar1 = alert_manager::should_post<libtorrent::peer_blocked_alert>
                        ((alert_manager *)CONCAT44(extraout_var,iVar4));
      if (bVar1) {
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_e8);
        local_ec = ip_filter;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar4),(torrent_handle *)local_e8,
                   (basic_endpoint<boost::asio::ip::tcp> *)local_74,&local_ec);
        torrent_handle::~torrent_handle((torrent_handle *)local_e8);
      }
    }
    else {
      local_ed.m_val = '\x01';
      if (v == V2) {
        local_ee.m_val = 0x80;
      }
      else {
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
        bitfield_flag(&local_ee,'\0');
      }
      ptVar5 = add_peer(this,(endpoint *)local_74,local_ed,(pex_flags_t)local_ee.m_val);
      if (ptVar5 != (torrent_peer *)0x0) {
        state_updated(this);
        uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
        if ((uVar3 & 1) != 0) {
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    (&local_130,(basic_endpoint<boost::asio::ip::tcp> *)local_74);
          boost::asio::ip::address::to_string_abi_cxx11_(&local_110,&local_130);
          uVar6 = ::std::__cxx11::string::c_str();
          bVar1 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
          if (bVar1) {
            this_01 = ::std::
                      unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                      ::operator->(&(this->super_torrent_hot_members).m_peer_list);
            local_1a0 = peer_list::num_connect_candidates(this_01);
          }
          else {
            local_1a0 = 0xffffffff;
          }
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"name-lookup add_peer() [ %s ] connect-candidates: %d",uVar6,
                     (ulong)local_1a0);
          ::std::__cxx11::string::~string((string *)&local_110);
        }
      }
      update_want_peers(this);
    }
  }
  return;
}

Assistant:

void torrent::on_peer_name_lookup(error_code const& e
		, std::vector<address> const& host_list, int const port
		, protocol_version const v) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		COMPLETE_ASYNC("torrent::on_peer_name_lookup");

#ifndef TORRENT_DISABLE_LOGGING
		if (e && should_log())
			debug_log("peer name lookup error: %s", e.message().c_str());
#endif

		if (e || m_abort || host_list.empty() || m_ses.is_aborted()) return;

		// TODO: add one peer per IP the hostname resolves to
		tcp::endpoint host(host_list.front(), std::uint16_t(port));

		if (m_ip_filter && m_ip_filter->access(host.address()) & ip_filter::blocked)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("blocked ip from tracker: %s", host.address().to_string().c_str());
			}
#endif
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, host, peer_blocked_alert::ip_filter);
			return;
		}

		if (add_peer(host, peer_info::tracker, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0)))
		{
			state_updated();

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("name-lookup add_peer() [ %s ] connect-candidates: %d"
					, host.address().to_string().c_str()
					, m_peer_list ? m_peer_list->num_connect_candidates() : -1);
			}
#endif
		}
		update_want_peers();
	}
	catch (...) { handle_exception(); }